

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MyPlanner::MyPlanner(MyPlanner *this)

{
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"TRIVIAL",&local_91);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"TRIVIAL",&local_92);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"TRIVIAL",&local_93);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"TRIVIAL",&local_94);
  despot::Planner::Planner(&this->super_Planner,local_30,local_50,local_70,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)this = &PTR__Planner_0010dd20;
  return;
}

Assistant:

MyPlanner() {
	}